

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O2

void stable_grail_merge_left(int **arr,int L1,int L2,int M)

{
  int *piVar1;
  long lVar2;
  int **ppiVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  
  ppiVar3 = arr + M;
  lVar2 = (long)M << 0x20;
  iVar4 = 0;
  iVar5 = L1;
  do {
    if (L2 + L1 <= iVar5) {
      if (M == iVar4) {
        return;
      }
      stable_grail_swap_n((int **)((lVar2 >> 0x1d) + (long)arr),arr + iVar4,L1 - iVar4);
      return;
    }
    if (L1 == iVar4) {
      piVar6 = arr[iVar5];
LAB_0010e773:
      piVar1 = *ppiVar3;
      *ppiVar3 = piVar6;
      arr[iVar5] = piVar1;
      iVar5 = iVar5 + 1;
    }
    else {
      piVar6 = arr[iVar5];
      if (*piVar6 < *arr[iVar4]) goto LAB_0010e773;
      piVar6 = *ppiVar3;
      *ppiVar3 = arr[iVar4];
      arr[iVar4] = piVar6;
      iVar4 = iVar4 + 1;
    }
    lVar2 = lVar2 + 0x100000000;
    M = M + 1;
    ppiVar3 = ppiVar3 + 1;
  } while( true );
}

Assistant:

static void GRAIL_MERGE_LEFT(SORT_TYPE *arr, int L1, int L2, int M) {
  int p0 = 0, p1 = L1;
  L2 += L1;

  while (p1 < L2) {
    if (p0 == L1 || SORT_CMP_A(arr + p0, arr + p1) > 0) {
      GRAIL_SWAP1(arr + (M++), arr + (p1++));
    } else {
      GRAIL_SWAP1(arr + (M++), arr + (p0++));
    }
  }

  if (M != p0) {
    GRAIL_SWAP_N(arr + M, arr + p0, L1 - p0);
  }
}